

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O0

ostream * setup::operator<<(ostream *os,version *version)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  ostream *poVar4;
  void *extraout_RDX;
  version *in_RSI;
  void *pvVar5;
  ostream *in_RDI;
  version *in_stack_ffffffffffffffd0;
  
  uVar3 = setup::version::a(in_RSI);
  poVar4 = (ostream *)std::ostream::operator<<(in_RDI,uVar3);
  poVar4 = std::operator<<(poVar4,'.');
  uVar3 = setup::version::b(in_RSI);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
  pvVar5 = (void *)0x2e;
  poVar4 = std::operator<<(poVar4,'.');
  uVar3 = setup::version::c(in_RSI,pvVar5,extraout_RDX);
  std::ostream::operator<<(poVar4,uVar3);
  uVar3 = setup::version::d(in_RSI);
  if (uVar3 != 0) {
    in_stack_ffffffffffffffd0 = (version *)std::operator<<(in_RDI,'.');
    uVar3 = setup::version::d(in_RSI);
    std::ostream::operator<<(in_stack_ffffffffffffffd0,uVar3);
  }
  bVar1 = setup::version::is_unicode(in_stack_ffffffffffffffd0);
  if (bVar1) {
    std::operator<<(in_RDI," (unicode)");
  }
  uVar2 = setup::version::bits(in_stack_ffffffffffffffd0);
  if (uVar2 != 0x20) {
    poVar4 = std::operator<<(in_RDI," (");
    uVar2 = setup::version::bits(in_stack_ffffffffffffffd0);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)uVar2);
    std::operator<<(poVar4,"-bit)");
  }
  bVar1 = setup::version::is_isx(in_stack_ffffffffffffffd0);
  if (bVar1) {
    std::operator<<(in_RDI," (isx)");
  }
  return in_RDI;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const version & version) {
	
	os << version.a() << '.' << version.b() << '.' << version.c();
	if(version.d()) {
		os << '.' << version.d();
	}
	
	if(version.is_unicode()) {
		os << " (unicode)";
	}
	
	if(version.bits() != 32) {
		os << " (" << int(version.bits()) << "-bit)";
	}
	
	if(version.is_isx()) {
		os << " (isx)";
	}
	
	return os;
}